

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O2

String * __thiscall
CommandLineOption::describe(String *__return_storage_ptr__,CommandLineOption *this)

{
  String local_38;
  
  if (*(this->_longform)._string._M_dataplus._M_p == '\0') {
    local_38._string.field_2._M_local_buf[1] = this->_shortform;
    local_38._string._M_dataplus._M_p = (pointer)&local_38._string.field_2;
    local_38._string.field_2._M_local_buf[0] = '-';
    local_38._string.field_2._M_allocated_capacity._2_2_ = 0;
    local_38._string._M_string_length = 3;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  }
  else {
    String::String(&local_38,"--");
    String::operator+(__return_storage_ptr__,&local_38,&this->_longform);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline String describe() const
	{
		return std::strlen (_longform)
			? (String ("--") + _longform)
			: String ({'-', _shortform, '\0'});
	}